

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_trans_double_path.cpp
# Opt level: O1

double __thiscall
agg::trans_double_path::finalize_path(trans_double_path *this,vertex_storage *vertices)

{
  vertex_dist **ppvVar1;
  vertex_dist *pvVar2;
  vertex_dist *pvVar3;
  double dVar4;
  uint uVar5;
  uint uVar6;
  double dVar7;
  double dVar8;
  
  vertex_sequence<agg::vertex_dist,_6U>::close(vertices,0);
  uVar5 = (vertices->super_pod_bvector<agg::vertex_dist,_6U>).m_size;
  if (2 < uVar5) {
    ppvVar1 = (vertices->super_pod_bvector<agg::vertex_dist,_6U>).m_blocks;
    uVar6 = uVar5 - 2 & 0x3f;
    dVar8 = ppvVar1[uVar5 - 2 >> 6][uVar6].dist;
    dVar7 = ppvVar1[uVar5 - 3 >> 6][uVar5 - 3 & 0x3f].dist;
    if (dVar8 * 10.0 < dVar7) {
      pvVar3 = ppvVar1[uVar5 - 2 >> 6] + uVar6;
      pvVar2 = ppvVar1[uVar5 - 1 >> 6];
      uVar5 = uVar5 - 1 & 0x3f;
      pvVar3->dist = pvVar2[uVar5].dist;
      pvVar2 = pvVar2 + uVar5;
      dVar4 = pvVar2->y;
      pvVar3->x = pvVar2->x;
      pvVar3->y = dVar4;
      uVar5 = (vertices->super_pod_bvector<agg::vertex_dist,_6U>).m_size;
      if (uVar5 != 0) {
        (vertices->super_pod_bvector<agg::vertex_dist,_6U>).m_size = uVar5 - 1;
      }
      uVar5 = (vertices->super_pod_bvector<agg::vertex_dist,_6U>).m_size - 2;
      (vertices->super_pod_bvector<agg::vertex_dist,_6U>).m_blocks[uVar5 >> 6][uVar5 & 0x3f].dist =
           dVar8 + dVar7;
    }
  }
  uVar5 = (vertices->super_pod_bvector<agg::vertex_dist,_6U>).m_size;
  if (uVar5 == 0) {
    dVar8 = 0.0;
  }
  else {
    ppvVar1 = (vertices->super_pod_bvector<agg::vertex_dist,_6U>).m_blocks;
    uVar6 = 0;
    dVar7 = 0.0;
    do {
      pvVar3 = ppvVar1[uVar6 >> 6];
      dVar8 = pvVar3[uVar6 & 0x3f].dist + dVar7;
      pvVar3[uVar6 & 0x3f].dist = dVar7;
      uVar6 = uVar6 + 1;
      dVar7 = dVar8;
    } while (uVar5 != uVar6);
  }
  return (double)(uVar5 - 1) / dVar8;
}

Assistant:

double trans_double_path::finalize_path(vertex_storage& vertices)
    {
        unsigned i;
        double dist;
        double d;

        vertices.close(false);
        if(vertices.size() > 2)
        {
            if(vertices[vertices.size() - 2].dist * 10.0 < 
               vertices[vertices.size() - 3].dist)
            {
                d = vertices[vertices.size() - 3].dist + 
                    vertices[vertices.size() - 2].dist;

                vertices[vertices.size() - 2] = 
                    vertices[vertices.size() - 1];

                vertices.remove_last();
                vertices[vertices.size() - 2].dist = d;
            }
        }

        dist = 0;
        for(i = 0; i < vertices.size(); i++)
        {
            vertex_dist& v = vertices[i];
            d = v.dist;
            v.dist = dist;
            dist += d;
        }

        return (vertices.size() - 1) / dist;
    }